

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_NopointerSerialization_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  Type type;
  FILE *this_00;
  value_type expression_text;
  size_type sVar6;
  value_type this_01;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  AssertionResult *this_03;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_04;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff9d0;
  Type in_stack_fffffffffffff9dc;
  AssertHelper *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  char *in_stack_fffffffffffffa20;
  undefined6 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2e;
  undefined1 in_stack_fffffffffffffa2f;
  uint i_00;
  string local_588 [48];
  key_type local_558;
  undefined1 local_551;
  AssertionResult local_550;
  string local_540 [40];
  value_type *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  AssertionResult local_508 [2];
  Type local_4e4;
  value_type local_490;
  AssertionResult local_488;
  string local_478 [48];
  key_type local_448;
  undefined1 local_441;
  AssertionResult local_440 [2];
  key_type local_41c;
  value_type local_3c8;
  AssertionResult local_3c0 [2];
  key_type local_39c;
  value_type local_348;
  AssertionResult local_340;
  string local_330 [55];
  undefined1 local_2f9;
  AssertionResult local_2f8;
  string local_2e8 [55];
  undefined1 local_2b1;
  AssertionResult local_2b0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2a0 [2];
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_278;
  string local_1e0 [55];
  undefined1 local_1a9;
  AssertionResult local_1a8;
  string local_198 [55];
  undefined1 local_161;
  AssertionResult local_160;
  FILE *local_150;
  key_type local_148;
  key_type local_144;
  value_type local_e4;
  int local_dc;
  key_type local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8 [2];
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a0;
  
  bVar1 = google::
          HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    i_00 = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
    this_04 = (BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)(ulong)i_00;
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_c8,i_00,(int *)this_04);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              (in_stack_fffffffffffff9d0,
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (hasher *)in_stack_fffffffffffff9c0,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
               (allocator_type *)in_stack_fffffffffffff9b0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_c8);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    local_d8 = kVar4;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff9b0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    for (local_dc = 1; local_dc < 100; local_dc = local_dc + 1) {
      local_e4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),0);
      google::
      BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               in_stack_fffffffffffffae8);
    }
    local_144 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff9b0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    local_148 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff9b0,
            (key_type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    this_00 = tmpfile();
    local_161 = this_00 != (FILE *)0x0;
    local_150 = this_00;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9b0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf69252);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(in_stack_fffffffffffffa2f,
                          CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)),
                 in_stack_fffffffffffffa20,
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)
                 CONCAT17(in_stack_fffffffffffffa2f,
                          CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_198);
      testing::Message::~Message((Message *)0xf69315);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf693a9);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,_IO_FILE>
                      (&local_a0,local_150);
    local_1a9 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9b0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf693f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)),
                 in_stack_fffffffffffffa20,
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_1e0);
      testing::Message::~Message((Message *)0xf694c5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6955c);
    rewind(local_150);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_2a0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashMap
              (in_stack_fffffffffffff9d0,
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (hasher *)in_stack_fffffffffffff9c0,
               (key_equal *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
               (allocator_type *)in_stack_fffffffffffff9b0);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_2a0);
    local_2b1 = local_150 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9b0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf69604);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)),
                 in_stack_fffffffffffffa20,
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa2e,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_2e8);
      testing::Message::~Message((Message *)0xf69718);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf697ac);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,_IO_FILE>
                      (&local_278,local_150);
    local_2f9 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9b0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf697f3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)),
                 in_stack_fffffffffffffa20,
                 (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_330);
      testing::Message::~Message((Message *)0xf698c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6995f);
    fclose(local_150);
    expression_text =
         HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),0);
    local_348 = expression_text;
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    local_39c = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_04,(key_type *)CONCAT44(i_00,kVar4));
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf699e3);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (char *)in_stack_fffffffffffff9c0,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
               ,(pair<const_int,_int> *)in_stack_fffffffffffff9b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      in_stack_fffffffffffffa10 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf69a51);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      testing::Message::~Message((Message *)0xf69aae);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf69b1f);
    local_3c8 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),0);
    local_41c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_04,(key_type *)CONCAT44(i_00,kVar4));
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf69b94);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (char *)in_stack_fffffffffffff9c0,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
               ,(pair<const_int,_int> *)in_stack_fffffffffffff9b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::AssertionResult::failure_message((AssertionResult *)0xf69c02);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      testing::Message::~Message((Message *)0xf69c5f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf69cd0);
    local_448 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    sVar6 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(in_stack_fffffffffffff9b0,
                    (key_type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    local_441 = sVar6 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9b0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf69d38);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff9e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)),
                 (char *)expression_text,(char *)CONCAT44(kVar5,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                 (char *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                 (char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_478);
      testing::Message::~Message((Message *)0xf69e0d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf69ea4);
    this_01 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),0);
    local_490 = this_01;
    type = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    local_4e4 = type;
    google::
    BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(this_04,(key_type *)CONCAT44(i_00,kVar4));
    google::
    sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf69f19);
    testing::internal::EqHelper::
    Compare<std::pair<const_int,_int>,_std::pair<const_int,_int>,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (char *)in_stack_fffffffffffff9c0,
               (pair<const_int,_int> *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
               ,(pair<const_int,_int> *)in_stack_fffffffffffff9b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      in_stack_fffffffffffff9d0 =
           (HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf69f87);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,type,(char *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9cc,(char *)in_stack_fffffffffffff9c0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      testing::Message::~Message((Message *)0xf69fe4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6a055);
    kVar4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
    this_02 = (HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)google::
                 BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::count(in_stack_fffffffffffff9b0,
                         (key_type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff9b0,
               (bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf6a0bd);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)),
                 (char *)expression_text,(char *)CONCAT44(kVar5,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,type,(char *)in_stack_fffffffffffff9d0,kVar4,
                 (char *)this_02);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9b0);
      std::__cxx11::string::~string(local_540);
      testing::Message::~Message((Message *)0xf6a192);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6a229);
    local_558 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(this_02,in_stack_fffffffffffff9bc);
    this_03 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff9b0,
                      (key_type *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
    local_551 = this_03 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_03,(bool *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (type *)0xf6a291);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_550);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)),
                 (char *)expression_text,(char *)CONCAT44(kVar5,in_stack_fffffffffffffa18),
                 in_stack_fffffffffffffa10);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,type,(char *)in_stack_fffffffffffff9d0,kVar4,
                 (char *)this_02);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,
                 (Message *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffa28)));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
      std::__cxx11::string::~string(local_588);
      testing::Message::~Message((Message *)0xf6a366);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf6a3fa);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf6a407);
    google::
    HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashMap
              ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf6a414);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, NopointerSerialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}